

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O2

void read_sei_payload(h264_stream_t *h,bs_t *b)

{
  sei_t *psVar1;
  uint32_t uVar2;
  sei_scalability_info_t *psVar3;
  int iVar4;
  long lVar5;
  
  psVar1 = h->sei;
  if (psVar1->payloadType == 0x18) {
    psVar3 = (sei_scalability_info_t *)calloc(1,0x6fa0c);
    (psVar1->field_2).sei_svc = psVar3;
    read_sei_scalability_info(h,b);
    return;
  }
  iVar4 = psVar1->payloadSize;
  psVar3 = (sei_scalability_info_t *)calloc(1,(long)iVar4);
  (psVar1->field_2).sei_svc = psVar3;
  for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    uVar2 = bs_read_u8(b);
    *(char *)((long)((psVar1->field_2).sei_svc)->layers[0].roi + lVar5 + -0x4a) = (char)uVar2;
    iVar4 = psVar1->payloadSize;
  }
  return;
}

Assistant:

void read_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 1 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            read_sei_scalability_info( h, b );
            break;
        default:
            if( 1 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                s->data[i] = bs_read_u8(b);
    }
    
    //if( 1 )
    //    read_sei_end_bits(h, b);
}